

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O1

int xpath_position(lyxp_set **UNUSED_args,uint16_t UNUSED_arg_count,lyd_node *UNUSED_cur_node,
                  lys_module *UNUSED_local_mod,lyxp_set *set,int options)

{
  char *pcVar1;
  longdouble number;
  
  switch(set->type) {
  case LYXP_SET_EMPTY:
    number = (longdouble)0;
    goto LAB_00170e95;
  case LYXP_SET_NODE_SET:
    number = (longdouble)set->ctx_pos;
LAB_00170e95:
    set_fill_number(set,number);
    return 0;
  case LYXP_SET_SNODE_SET:
    pcVar1 = "schema node set";
    break;
  case LYXP_SET_BOOLEAN:
    pcVar1 = "boolean";
    break;
  case LYXP_SET_NUMBER:
    pcVar1 = "number";
    break;
  case LYXP_SET_STRING:
    pcVar1 = "string";
    break;
  default:
    pcVar1 = (char *)0x0;
  }
  ly_vlog(LYE_XPATH_INCTX,LY_VLOG_NONE,(void *)0x0,pcVar1,"position()");
  return -1;
}

Assistant:

static int
xpath_position(struct lyxp_set **UNUSED(args), uint16_t UNUSED(arg_count), struct lyd_node *UNUSED(cur_node),
               struct lys_module *UNUSED(local_mod), struct lyxp_set *set, int options)
{
    if (set->type == LYXP_SET_EMPTY) {
        set_fill_number(set, 0);
        return EXIT_SUCCESS;
    }
    if (set->type != LYXP_SET_NODE_SET) {
        LOGVAL(LYE_XPATH_INCTX, LY_VLOG_NONE, NULL, print_set_type(set), "position()");
        return -1;
    }

    set_fill_number(set, set->ctx_pos);

    /* UNUSED in 'Release' build type */
    (void)options;
    return EXIT_SUCCESS;
}